

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O2

u32 __thiscall moira::Moira::logic<(moira::Core)1,(moira::Instr)276,1>(Moira *this,u32 op1,u32 op2)

{
  byte bVar1;
  
  bVar1 = (byte)(op1 ^ op2);
  (this->reg).sr.n = (bool)(bVar1 >> 7);
  (this->reg).sr.z = bVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  return op1 ^ op2;
}

Assistant:

u32
Moira::logic(u32 op1, u32 op2)
{
    u32 result;

    switch (I) {

        case Instr::AND: case Instr::ANDI: case Instr::ANDICCR: case Instr::ANDISR: case Instr::AND_LOOP:

            result = op1 & op2;
            break;

        case Instr::OR: case Instr::ORI: case Instr::ORICCR: case Instr::ORISR: case Instr::OR_LOOP:

            result = op1 | op2;
            break;

        case Instr::EOR: case Instr::EORI: case Instr::EORICCR: case Instr::EORISR: case Instr::EOR_LOOP:

            result = op1 ^ op2;
            break;

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(result);
    reg.sr.z = ZERO<S>(result);
    reg.sr.v = 0;
    reg.sr.c = 0;
    return result;
}